

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::FactorAlternationImpl::Round1
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  bool bVar1;
  int local_74;
  Regexp **local_70;
  int local_64;
  Regexp *pRStack_60;
  int j;
  Regexp *prefix;
  ParseFlags local_50;
  int same;
  ParseFlags runeflags_i;
  int nrune_i;
  Rune *rune_i;
  ParseFlags local_38;
  int i;
  ParseFlags runeflags;
  int nrune;
  Rune *rune;
  vector<re2::Splice,std::allocator<re2::Splice>> *pvStack_20;
  int start;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices_local;
  ParseFlags flags_local;
  int nsub_local;
  Regexp **sub_local;
  
  rune._4_4_ = 0;
  _runeflags = (Rune *)0x0;
  i = 0;
  local_38 = NoParseFlags;
  rune_i._4_4_ = 0;
  pvStack_20 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  splices_local._0_4_ = flags;
  splices_local._4_4_ = nsub;
  _flags_local = sub;
  do {
    if (splices_local._4_4_ < rune_i._4_4_) {
      return;
    }
    _runeflags_i = (Rune *)0x0;
    same = 0;
    local_50 = NoParseFlags;
    if ((rune_i._4_4_ < splices_local._4_4_) &&
       (_runeflags_i = Regexp::LeadingString(_flags_local[rune_i._4_4_],&same,&local_50),
       local_50 == local_38)) {
      prefix._4_4_ = 0;
      while( true ) {
        bVar1 = false;
        if ((prefix._4_4_ < i) && (bVar1 = false, prefix._4_4_ < same)) {
          bVar1 = _runeflags[prefix._4_4_] == _runeflags_i[prefix._4_4_];
        }
        if (!bVar1) break;
        prefix._4_4_ = prefix._4_4_ + 1;
      }
      if (prefix._4_4_ < 1) goto LAB_0037a9d3;
      i = prefix._4_4_;
    }
    else {
LAB_0037a9d3:
      if ((rune_i._4_4_ != rune._4_4_) && (rune_i._4_4_ != rune._4_4_ + 1)) {
        pRStack_60 = Regexp::LiteralString(_runeflags,i,local_38);
        for (local_64 = rune._4_4_; local_64 < rune_i._4_4_; local_64 = local_64 + 1) {
          Regexp::RemoveLeadingString(_flags_local[local_64],i);
        }
        local_70 = _flags_local + rune._4_4_;
        local_74 = rune_i._4_4_ - rune._4_4_;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>
                  (pvStack_20,&stack0xffffffffffffffa0,&local_70,&local_74);
      }
      if (rune_i._4_4_ < splices_local._4_4_) {
        rune._4_4_ = rune_i._4_4_;
        _runeflags = _runeflags_i;
        i = same;
        local_38 = local_50;
      }
    }
    rune_i._4_4_ = rune_i._4_4_ + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round1(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 1: Factor out common literal prefixes.
  int start = 0;
  Rune* rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with rune[0:nrune].
    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < nsub) {
      rune_i = Regexp::LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune],
    // but sub[i] does not even begin with rune[0].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = Regexp::LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        Regexp::RemoveLeadingString(sub[j], nrune);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
}